

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

U32 ZSTD_window_update(ZSTD_window_t *window,void *src,size_t srcSize,int forceNonContiguous)

{
  ulong uVar1;
  long lVar2;
  U32 local_58;
  U32 lowLimitMax;
  ptrdiff_t highInputIdx;
  size_t distanceFromBase;
  U32 contiguous;
  BYTE *ip;
  int forceNonContiguous_local;
  size_t srcSize_local;
  void *src_local;
  ZSTD_window_t *window_local;
  
  distanceFromBase._4_4_ = 1;
  if (srcSize == 0) {
    window_local._4_4_ = 1;
  }
  else {
    if (window->base == (BYTE *)0x0) {
      __assert_fail("window->base != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x4ea,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    if (window->dictBase == (BYTE *)0x0) {
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x4eb,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    if (((BYTE *)src != window->nextSrc) || (forceNonContiguous != 0)) {
      uVar1 = (long)window->nextSrc - (long)window->base;
      window->lowLimit = window->dictLimit;
      if (uVar1 != (uVar1 & 0xffffffff)) {
        __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x4f2,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
      }
      window->dictLimit = (U32)uVar1;
      window->dictBase = window->base;
      window->base = (BYTE *)((long)src - uVar1);
      if (window->dictLimit - window->lowLimit < 8) {
        window->lowLimit = window->dictLimit;
      }
      distanceFromBase._4_4_ = 0;
    }
    window->nextSrc = (BYTE *)((long)src + srcSize);
    if (window->dictBase + window->lowLimit < (BYTE *)((long)src + srcSize) &&
        src < window->dictBase + window->dictLimit) {
      lVar2 = (long)src + (srcSize - (long)window->dictBase);
      if ((long)(ulong)window->dictLimit < lVar2) {
        local_58 = window->dictLimit;
      }
      else {
        local_58 = (U32)lVar2;
      }
      window->lowLimit = local_58;
    }
    window_local._4_4_ = distanceFromBase._4_4_;
  }
  return window_local._4_4_;
}

Assistant:

MEM_STATIC U32 ZSTD_window_update(ZSTD_window_t* window,
                                  void const* src, size_t srcSize,
                                  int forceNonContiguous)
{
    BYTE const* const ip = (BYTE const*)src;
    U32 contiguous = 1;
    DEBUGLOG(5, "ZSTD_window_update");
    if (srcSize == 0)
        return contiguous;
    assert(window->base != NULL);
    assert(window->dictBase != NULL);
    /* Check if blocks follow each other */
    if (src != window->nextSrc || forceNonContiguous) {
        /* not contiguous */
        size_t const distanceFromBase = (size_t)(window->nextSrc - window->base);
        DEBUGLOG(5, "Non contiguous blocks, new segment starts at %u", window->dictLimit);
        window->lowLimit = window->dictLimit;
        assert(distanceFromBase == (size_t)(U32)distanceFromBase);  /* should never overflow */
        window->dictLimit = (U32)distanceFromBase;
        window->dictBase = window->base;
        window->base = ip - distanceFromBase;
        /* ms->nextToUpdate = window->dictLimit; */
        if (window->dictLimit - window->lowLimit < HASH_READ_SIZE) window->lowLimit = window->dictLimit;   /* too small extDict */
        contiguous = 0;
    }
    window->nextSrc = ip + srcSize;
    /* if input and dictionary overlap : reduce dictionary (area presumed modified by input) */
    if ( (ip+srcSize > window->dictBase + window->lowLimit)
       & (ip < window->dictBase + window->dictLimit)) {
        ptrdiff_t const highInputIdx = (ip + srcSize) - window->dictBase;
        U32 const lowLimitMax = (highInputIdx > (ptrdiff_t)window->dictLimit) ? window->dictLimit : (U32)highInputIdx;
        window->lowLimit = lowLimitMax;
        DEBUGLOG(5, "Overlapping extDict and input : new lowLimit = %u", window->lowLimit);
    }
    return contiguous;
}